

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_1::generateTextureBufferGenerationGroup
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                *group,GLenum target)

{
  long *plVar1;
  long *plVar2;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  undefined1 local_88 [56];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  code *local_30;
  GLenum local_28;
  
  local_88._4_4_ = 0x8518;
  if (target != 0x8513) {
    local_88._4_4_ = target;
  }
  local_88._20_4_ = 0x100;
  local_88[0x18] = false;
  local_88._32_8_ = (pointer)0x0;
  local_88._40_8_ = (pointer)0x0;
  local_88._48_8_ = (pointer)0x0;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_88[8] = true;
  local_88[9] = true;
  local_88._12_4_ = 0;
  local_88._16_4_ = 0;
  local_30 = glu::getTextureTargetName;
  local_88._0_4_ = target;
  local_50._M_p = (pointer)&local_40;
  local_28 = target;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_30);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_c8);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_98 = *plVar2;
    lStack_90 = plVar1[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar2;
    local_a8 = (long *)*plVar1;
  }
  local_a0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(group,(value_type *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if ((pointer)local_88._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._32_8_,local_88._48_8_ - local_88._32_8_);
  }
  return;
}

Assistant:

static void generateTextureBufferGenerationGroup (std::vector<TextureGenerationSpec>& group, glw::GLenum target)
{
	const glw::GLenum queryTarget = (target == GL_TEXTURE_CUBE_MAP) ? (GL_TEXTURE_CUBE_MAP_NEGATIVE_Y) : (target);

	// initial
	{
		TextureGenerationSpec texGen;
		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= 0;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", initial values";

		group.push_back(texGen);
	}

	// actual specification tests are in texture_buffer tests, no need to do them here too
}